

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int EncodeData(BrotliEncoderState *s,int is_last,int force_flush,size_t *out_size,uint8_t **output)

{
  MemoryManager *m;
  size_t *last_insert_len;
  size_t *num_literals;
  ushort uVar1;
  uint uVar2;
  uint8_t *data;
  HasherHandle puVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  size_t num_commands;
  undefined8 uVar6;
  uint16_t uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ContextType literal_context_mode;
  HasherCommon *common;
  ulong uVar12;
  uint32_t *puVar13;
  uint8_t *puVar14;
  int *piVar15;
  ulong uVar16;
  Command_conflict *pCVar17;
  char cVar18;
  byte bVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  size_t __n;
  ulong uVar23;
  size_t *psVar24;
  ulong uVar25;
  ushort uVar26;
  BrotliHasherParams *pBVar27;
  ulong uVar28;
  BrotliEncoderState *pBVar29;
  ushort uVar30;
  uint32_t uVar31;
  ulong uVar32;
  long lVar33;
  BrotliHasherParams *pBVar34;
  ulong uVar35;
  byte prev_byte;
  byte prev_byte2;
  uint uVar36;
  uint uVar37;
  BrotliHasherParams *pBVar38;
  ulong mask;
  ulong uVar39;
  int *piVar40;
  size_t sVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  bool bVar45;
  byte bVar46;
  size_t storage_ix_1;
  BrotliHasherParams *local_210;
  ulong local_208;
  size_t *local_200;
  ulong local_1f8;
  BrotliHasherParams *local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  int *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  uint8_t **local_1b8;
  uint32_t *local_1b0;
  size_t num_literal_contexts;
  ulong local_1a0;
  ulong local_198;
  size_t storage_ix;
  BlockSplit local_160;
  BlockSplit local_130;
  uint32_t *local_100;
  size_t sStack_f8;
  uint32_t *local_f0;
  size_t sStack_e8;
  HistogramLiteral *local_e0;
  size_t sStack_d8;
  HistogramCommand *local_d0;
  size_t sStack_c8;
  HistogramDistance *local_c0;
  size_t sStack_b8;
  size_t table_size;
  uint local_70;
  
  bVar46 = 0;
  local_208 = s->last_processed_pos_;
  uVar23 = local_208 & 0xffffffff;
  if (2 < local_208 >> 0x1e) {
    uVar23 = (ulong)(((int)((uint)local_208 * 2) >> 1 & 0xc0000000U) +
                     ((uint)local_208 & 0x3fffffff) + 0x80000000);
  }
  uVar16 = s->input_pos_;
  local_1b8 = output;
  EnsureInitialized(s);
  uVar28 = local_208;
  if (s->is_last_block_emitted_ != 0) {
    return 0;
  }
  local_1c0 = CONCAT44(local_1c0._4_4_,force_flush);
  uVar12 = uVar16 - local_208;
  if (is_last != 0) {
    s->is_last_block_emitted_ = 1;
  }
  uVar2 = (s->ringbuffer_).mask_;
  mask = (ulong)uVar2;
  data = (s->ringbuffer_).buffer_;
  local_200 = out_size;
  local_1e8 = uVar16;
  EnsureInitialized(s);
  if ((ulong)(1L << ((byte)(s->params).lgblock & 0x3f)) < uVar12) {
    return 0;
  }
  m = &s->memory_manager_;
  if (((s->params).quality == 1) && (s->command_buf_ == (uint32_t *)0x0)) {
    puVar13 = (uint32_t *)BrotliAllocate(m,0x80000);
    s->command_buf_ = puVar13;
    puVar14 = (uint8_t *)BrotliAllocate(m,0x20000);
    s->literal_buf_ = puVar14;
  }
  uVar20 = (uint)uVar12;
  uVar11 = (uint)uVar23;
  if ((uint)(s->params).quality < 2) {
    storage_ix = (size_t)s->last_bytes_bits_;
    if (is_last == 0 && local_1e8 == uVar28) {
      sVar41 = 0;
    }
    else {
      puVar14 = GetBrotliStorage(s,(ulong)(uVar20 * 2 + 0x1f7));
      *puVar14 = (uint8_t)s->last_bytes_;
      puVar14[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
      uVar12 = uVar12 & 0xffffffff;
      piVar15 = GetHashTable(s,(s->params).quality,uVar12,&table_size);
      psVar24 = local_200;
      if ((s->params).quality == 0) {
        BrotliCompressFragmentFast
                  (m,data + (uVar11 & uVar2),uVar12,is_last,piVar15,table_size,s->cmd_depths_,
                   s->cmd_bits_,&s->cmd_code_numbits_,s->cmd_code_,&storage_ix,puVar14);
      }
      else {
        BrotliCompressFragmentTwoPass
                  (m,data + (uVar11 & uVar2),uVar12,is_last,s->command_buf_,s->literal_buf_,piVar15,
                   table_size,&storage_ix,puVar14);
        psVar24 = local_200;
      }
      sVar41 = storage_ix >> 3;
      s->last_bytes_ = (ushort)puVar14[sVar41];
      s->last_bytes_bits_ = (byte)storage_ix & 7;
      UpdateLastProcessedPos(s);
      *local_1b8 = puVar14;
      local_200 = psVar24;
    }
    *local_200 = sVar41;
    return 1;
  }
  uVar16 = s->num_commands_ + (uVar12 >> 1 & 0x7fffffff) + 1;
  if (s->cmd_alloc_size_ < uVar16) {
    sVar41 = (uVar12 >> 2 & 0x3fffffff) + uVar16 + 0x10;
    s->cmd_alloc_size_ = sVar41;
    if (sVar41 == 0) {
      pCVar17 = (Command_conflict *)0x0;
    }
    else {
      pCVar17 = (Command_conflict *)BrotliAllocate(m,sVar41 * 0x10);
    }
    if (s->commands_ != (Command_conflict *)0x0) {
      memcpy(pCVar17,s->commands_,s->num_commands_ << 4);
      BrotliFree(m,s->commands_);
      s->commands_ = (Command_conflict *)0x0;
    }
    s->commands_ = pCVar17;
  }
  bVar44 = is_last != 0;
  uVar16 = uVar12 & 0xffffffff;
  bVar45 = uVar11 == 0;
  if (s->hasher_ == (HasherHandle)0x0) {
    local_210 = &(s->params).hasher;
    iVar10 = (s->params).quality;
    if (iVar10 < 10) {
      if ((iVar10 == 4) && (0xfffff < (s->params).size_hint)) {
        local_210->type = 0x36;
      }
      else if (iVar10 < 5) {
        local_210->type = iVar10;
      }
      else {
        iVar8 = (s->params).lgwin;
        if (iVar8 < 0x11) {
          iVar8 = 0x28;
          if (6 < iVar10) {
            iVar8 = (iVar10 == 9) + 0x29;
          }
          local_210->type = iVar8;
        }
        else {
          if ((iVar8 < 0x13) || ((s->params).size_hint < 0x100000)) {
            (s->params).hasher.type = 5;
            (s->params).hasher.block_bits = iVar10 + -1;
            iVar8 = 10;
            if (iVar10 == 9) {
              iVar8 = 0x10;
            }
            iVar9 = 4;
            if (6 < iVar10) {
              iVar9 = iVar8;
            }
            (s->params).hasher.bucket_bits = iVar10 < 7 ^ 0xf;
          }
          else {
            (s->params).hasher.type = 6;
            (s->params).hasher.bucket_bits = 0xf;
            (s->params).hasher.block_bits = iVar10 + -1;
            (s->params).hasher.hash_len = 5;
            iVar8 = 10;
            if (iVar10 == 9) {
              iVar8 = 0x10;
            }
            iVar9 = 4;
            if (6 < iVar10) {
              iVar9 = iVar8;
            }
          }
          (s->params).hasher.num_last_distances_to_check = iVar9;
        }
      }
    }
    else {
      local_210->type = 10;
    }
    iVar10 = local_210->type;
    sVar41 = 0x28;
    if (iVar10 < 0x28) {
      switch(iVar10) {
      case 2:
        sVar41 = 0x4002c;
        break;
      case 3:
        sVar41 = 0x40030;
        break;
      case 4:
switchD_001072c1_caseD_4:
        sVar41 = 0x80038;
        break;
      case 5:
        sVar41 = ((4L << ((byte)(s->params).hasher.block_bits & 0x3f) | 2U) <<
                 ((byte)(s->params).hasher.bucket_bits & 0x3f)) + 0x40;
        break;
      case 6:
        sVar41 = ((4L << ((byte)(s->params).hasher.block_bits & 0x3f) | 2U) <<
                 ((byte)(s->params).hasher.bucket_bits & 0x3f)) + 0x50;
        break;
      case 10:
        uVar32 = 1L << ((byte)(s->params).lgwin & 0x3f);
        uVar28 = uVar16;
        if (uVar32 < uVar16) {
          uVar28 = uVar32;
        }
        if (!bVar45 || !bVar44) {
          uVar28 = uVar32;
        }
        sVar41 = uVar28 * 8 + 0x80038;
      }
    }
    else if (iVar10 < 0x2a) {
      if ((iVar10 == 0x28) || (iVar10 == 0x29)) goto switchD_001072c1_caseD_4;
    }
    else if (iVar10 == 0x2a) {
      sVar41 = 0x140430;
    }
    else if (iVar10 == 0x36) {
      sVar41 = 0x400038;
    }
    piVar15 = (int *)BrotliAllocate(m,sVar41);
    s->hasher_ = (HasherHandle)piVar15;
    iVar10 = local_210->bucket_bits;
    iVar8 = local_210->block_bits;
    iVar9 = local_210->hash_len;
    piVar15[0] = local_210->type;
    piVar15[1] = iVar10;
    piVar15[2] = iVar8;
    piVar15[3] = iVar9;
    piVar15[4] = local_210->num_last_distances_to_check;
    iVar10 = *piVar15;
    if (iVar10 < 0x28) {
      if (iVar10 == 5) {
        puVar3 = s->hasher_;
        *(int *)(puVar3 + 0x38) = 0x20 - *(int *)(puVar3 + 4);
        *(long *)(puVar3 + 0x28) = 1L << ((byte)*(int *)(puVar3 + 4) & 0x3f);
        lVar21 = 1L << (puVar3[8] & 0x3f);
        *(long *)(puVar3 + 0x30) = lVar21;
        *(int *)(puVar3 + 0x3c) = (int)lVar21 + -1;
      }
      else if (iVar10 == 6) {
        puVar3 = s->hasher_;
        *(int *)(puVar3 + 0x38) = 0x40 - *(int *)(puVar3 + 4);
        *(ulong *)(puVar3 + 0x40) = 0xffffffffffffffff >> (puVar3[0xc] * -8 & 0x3f);
        *(long *)(puVar3 + 0x28) = 1L << ((byte)*(int *)(puVar3 + 4) & 0x3f);
        lVar21 = 1L << (puVar3[8] & 0x3f);
        *(long *)(puVar3 + 0x30) = lVar21;
        *(int *)(puVar3 + 0x48) = (int)lVar21 + -1;
      }
      else if (iVar10 == 10) {
        puVar3 = s->hasher_;
        uVar22 = -1 << ((byte)(s->params).lgwin & 0x1f);
        *(ulong *)(puVar3 + 0x28) = (ulong)~uVar22;
        *(uint *)(puVar3 + 0x80030) = uVar22 + 1;
      }
    }
    else if (iVar10 == 0x28) {
      iVar10 = (s->params).quality;
      *(ulong *)(s->hasher_ + 0x80030) = (ulong)((iVar10 < 7) + 7 << ((char)iVar10 - 4U & 0x1f));
    }
    else if (iVar10 == 0x29) {
      iVar10 = (s->params).quality;
      *(ulong *)(s->hasher_ + 0x80030) = (ulong)((iVar10 < 7) + 7 << ((char)iVar10 - 4U & 0x1f));
    }
    else if (iVar10 == 0x2a) {
      iVar10 = (s->params).quality;
      *(ulong *)(s->hasher_ + 0x140428) = (ulong)((iVar10 < 7) + 7 << ((char)iVar10 - 4U & 0x1f));
    }
    puVar3 = s->hasher_;
    if (puVar3 != (HasherHandle)0x0) {
      puVar3[0x14] = '\0';
      puVar3[0x15] = '\0';
      puVar3[0x16] = '\0';
      puVar3[0x17] = '\0';
    }
  }
  piVar15 = (int *)s->hasher_;
  if (piVar15[5] == 0) {
    iVar10 = *piVar15;
    if (iVar10 < 0x28) {
      switch(iVar10) {
      case 2:
        if ((uVar20 < 0x801) && (bVar45 && bVar44)) {
          if (uVar16 != 0) {
            uVar28 = 0;
            do {
              piVar15[((ulong)(*(long *)(data + uVar28) * -0x42e1ca5843000000) >> 0x30) + 10] = 0;
              uVar28 = uVar28 + 1;
            } while (uVar16 != uVar28);
          }
        }
        else {
          __n = 0x40004;
LAB_0010783b:
          memset(piVar15 + 10,0,__n);
        }
        break;
      case 3:
        if ((0x800 < uVar20) || (!bVar45 || !bVar44)) {
          __n = 0x40008;
          goto LAB_0010783b;
        }
        if (uVar16 != 0) {
          uVar28 = 0;
          do {
            lVar21 = *(long *)(data + uVar28);
            (piVar15 + ((ulong)(lVar21 * -0x42e1ca5843000000) >> 0x30) + 10)[0] = 0;
            (piVar15 + ((ulong)(lVar21 * -0x42e1ca5843000000) >> 0x30) + 10)[1] = 0;
            uVar28 = uVar28 + 1;
          } while (uVar16 != uVar28);
        }
        break;
      case 4:
        if ((0x1000 < uVar20) || (!bVar45 || !bVar44)) {
          __n = 0x80010;
          goto LAB_0010783b;
        }
        if (uVar16 != 0) {
          uVar28 = 0;
          do {
            piVar40 = piVar15 + ((ulong)(*(long *)(data + uVar28) * -0x42e1ca5843000000) >> 0x2f) +
                                10;
            piVar40[0] = 0;
            piVar40[1] = 0;
            piVar40[2] = 0;
            piVar40[3] = 0;
            uVar28 = uVar28 + 1;
          } while (uVar16 != uVar28);
        }
        break;
      case 5:
        PrepareH5((HasherHandle)piVar15,(uint)(bVar45 && bVar44),uVar16,data);
        break;
      case 6:
        PrepareH6((HasherHandle)piVar15,(uint)(bVar45 && bVar44),uVar16,data);
        break;
      case 10:
        iVar10 = piVar15[0x2000c];
        lVar21 = 0;
        do {
          piVar15[lVar21 + 0xc] = iVar10;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0x20000);
      }
    }
    else if (iVar10 < 0x2a) {
      if (iVar10 == 0x28) {
        if ((uVar20 < 0x201) && (bVar45 && bVar44)) {
          if (uVar16 != 0) {
            uVar28 = 0;
            do {
              uVar32 = (ulong)((uint)(*(int *)(data + uVar28) * 0x1e35a7bd) >> 0x11);
              piVar15[uVar32 + 10] = -0x33333334;
              *(undefined2 *)((long)piVar15 + uVar32 * 2 + 0x20028) = 0xcccc;
              uVar28 = uVar28 + 1;
            } while (uVar16 != uVar28);
          }
        }
        else {
LAB_00107789:
          memset(piVar15 + 10,0xcc,0x20000);
          memset(piVar15 + 0x800a,0,0x10000);
        }
      }
      else {
        if (iVar10 != 0x29) goto switchD_0010753b_caseD_7;
        if ((0x200 < uVar20) || (!bVar45 || !bVar44)) goto LAB_00107789;
        if (uVar16 != 0) {
          uVar28 = 0;
          do {
            uVar32 = (ulong)((uint)(*(int *)(data + uVar28) * 0x1e35a7bd) >> 0x11);
            piVar15[uVar32 + 10] = -0x33333334;
            *(undefined2 *)((long)piVar15 + uVar32 * 2 + 0x20028) = 0xcccc;
            uVar28 = uVar28 + 1;
          } while (uVar16 != uVar28);
        }
      }
      memset(piVar15 + 0xc00a,0,0x10000);
      *(undefined2 *)(piVar15 + 0x2000a) = 0;
    }
    else if (iVar10 == 0x2a) {
      if ((uVar20 < 0x201) && (bVar45 && bVar44)) {
        if (uVar16 != 0) {
          uVar28 = 0;
          do {
            uVar32 = (ulong)((uint)(*(int *)(data + uVar28) * 0x1e35a7bd) >> 0x11);
            piVar15[uVar32 + 10] = -0x33333334;
            *(undefined2 *)((long)piVar15 + uVar32 * 2 + 0x20028) = 0xcccc;
            uVar28 = uVar28 + 1;
          } while (uVar16 != uVar28);
        }
      }
      else {
        memset(piVar15 + 10,0xcc,0x20000);
        memset(piVar15 + 0x800a,0,0x10000);
      }
      memset(piVar15 + 0xc00a,0,0x10000);
      memset(piVar15 + 0x5000a,0,0x400);
    }
    else if (iVar10 == 0x36) {
      if ((0x8000 < uVar20) || (!bVar45 || !bVar44)) {
        __n = 0x400010;
        goto LAB_0010783b;
      }
      if (uVar16 != 0) {
        uVar28 = 0;
        do {
          piVar40 = piVar15 + ((ulong)(*(long *)(data + uVar28) * 0x35a7bd1e35a7bd00) >> 0x2c) + 10;
          piVar40[0] = 0;
          piVar40[1] = 0;
          piVar40[2] = 0;
          piVar40[3] = 0;
          uVar28 = uVar28 + 1;
        } while (uVar16 != uVar28);
      }
    }
switchD_0010753b_caseD_7:
    if (uVar11 == 0) {
      piVar15[6] = 0;
      piVar15[7] = 0;
      piVar15[8] = 0;
      piVar15[9] = 0;
    }
    piVar15[5] = 1;
  }
  piVar15 = (int *)s->hasher_;
  iVar10 = *piVar15;
  if (iVar10 < 0x28) {
    switch(iVar10) {
    case 2:
      if ((6 < uVar20) && (2 < uVar11)) {
        piVar15[((ulong)(*(long *)(data + (uVar11 - 3 & uVar2)) * -0x42e1ca5843000000) >> 0x30) + 10
               ] = uVar11 - 3;
        piVar15[((ulong)(*(long *)(data + (uVar11 - 2 & uVar2)) * -0x42e1ca5843000000) >> 0x30) + 10
               ] = uVar11 - 2;
        piVar15[((ulong)(*(long *)(data + (uVar11 - 1 & uVar2)) * -0x42e1ca5843000000) >> 0x30) + 10
               ] = uVar11 - 1;
      }
      break;
    case 3:
      if ((6 < uVar20) && (2 < uVar11)) {
        uVar22 = uVar11 - 3;
        *(uint *)((long)piVar15 +
                 (ulong)(((uint)(ushort)((ulong)(*(long *)(data + (uVar22 & uVar2)) *
                                                -0x42e1ca5843000000) >> 0x30) +
                         (uint)((uVar22 >> 3 & 1) != 0)) * 4) + 0x28) = uVar22;
        uVar22 = uVar11 - 2;
        *(uint *)((long)piVar15 +
                 (ulong)(((uint)(ushort)((ulong)(*(long *)(data + (uVar22 & uVar2)) *
                                                -0x42e1ca5843000000) >> 0x30) +
                         (uint)((uVar22 >> 3 & 1) != 0)) * 4) + 0x28) = uVar22;
        uVar22 = uVar11 - 1;
        *(uint *)((long)piVar15 +
                 (ulong)(((uint)(ushort)((ulong)(*(long *)(data + (uVar22 & uVar2)) *
                                                -0x42e1ca5843000000) >> 0x30) +
                         (uint)((uVar22 >> 3 & 1) != 0)) * 4) + 0x28) = uVar22;
      }
      break;
    case 4:
      if ((uVar20 < 7) || (uVar11 < 3)) break;
      uVar22 = uVar11 - 3;
      piVar15[(ulong)((uint)((ulong)(*(long *)(data + (uVar22 & uVar2)) * -0x42e1ca5843000000) >>
                            0x2f) + (uVar22 >> 3 & 3)) + 10] = uVar22;
      uVar22 = uVar11 - 2;
      piVar15[(ulong)((uint)((ulong)(*(long *)(data + (uVar22 & uVar2)) * -0x42e1ca5843000000) >>
                            0x2f) + (uVar22 >> 3 & 3)) + 10] = uVar22;
      uVar22 = (uint)((ulong)(*(long *)(data + (uVar11 - 1 & uVar2)) * -0x42e1ca5843000000) >> 0x2f)
      ;
      goto LAB_00107bfe;
    case 5:
      if ((2 < uVar20) && (2 < uVar11)) {
        uVar22 = (uint)(*(int *)(data + (uVar11 - 3 & uVar2)) * 0x1e35a7bd) >>
                 (*(byte *)(piVar15 + 0xe) & 0x1f);
        uVar1 = *(ushort *)((long)piVar15 + (ulong)uVar22 * 2 + 0x40);
        lVar21 = *(long *)(piVar15 + 10) * 2 + 0x40;
        *(uint *)((long)piVar15 +
                 (ulong)(uVar22 << (*(byte *)(piVar15 + 2) & 0x1f)) * 4 +
                 (ulong)(piVar15[0xf] & (uint)uVar1) * 4 + lVar21) = uVar11 - 3;
        *(ushort *)((long)piVar15 + (ulong)uVar22 * 2 + 0x40) = uVar1 + 1;
        uVar22 = (uint)(*(int *)(data + (uVar11 - 2 & uVar2)) * 0x1e35a7bd) >>
                 (*(byte *)(piVar15 + 0xe) & 0x1f);
        uVar1 = *(ushort *)((long)piVar15 + (ulong)uVar22 * 2 + 0x40);
        *(uint *)((long)piVar15 +
                 (ulong)(uVar22 << (*(byte *)(piVar15 + 2) & 0x1f)) * 4 +
                 (ulong)(piVar15[0xf] & (uint)uVar1) * 4 + lVar21) = uVar11 - 2;
        *(ushort *)((long)piVar15 + (ulong)uVar22 * 2 + 0x40) = uVar1 + 1;
        uVar22 = (uint)(*(int *)(data + (uVar11 - 1 & uVar2)) * 0x1e35a7bd) >>
                 (*(byte *)(piVar15 + 0xe) & 0x1f);
        uVar1 = *(ushort *)((long)piVar15 + (ulong)uVar22 * 2 + 0x40);
        *(uint *)((long)piVar15 +
                 (ulong)(uVar22 << (*(byte *)(piVar15 + 2) & 0x1f)) * 4 +
                 (ulong)(piVar15[0xf] & (uint)uVar1) * 4 + lVar21) = uVar11 - 1;
        *(ushort *)((long)piVar15 + (ulong)uVar22 * 2 + 0x40) = uVar1 + 1;
      }
      break;
    case 6:
      if ((6 < uVar20) && (2 < uVar11)) {
        uVar16 = *(ulong *)(piVar15 + 0x10);
        uVar28 = (*(ulong *)(data + (uVar11 - 3 & uVar2)) & uVar16) * 0x1fe35a7bd3579bd3 >>
                 (*(byte *)(piVar15 + 0xe) & 0x3f);
        uVar32 = uVar28 & 0xffffffff;
        uVar1 = *(ushort *)((long)piVar15 + uVar32 * 2 + 0x50);
        lVar21 = *(long *)(piVar15 + 10) * 2 + 0x50;
        *(uint *)((long)piVar15 +
                 (ulong)(uint)((int)uVar28 << (*(byte *)(piVar15 + 2) & 0x1f)) * 4 +
                 (ulong)(piVar15[0x12] & (uint)uVar1) * 4 + lVar21) = uVar11 - 3;
        *(ushort *)((long)piVar15 + uVar32 * 2 + 0x50) = uVar1 + 1;
        uVar28 = (*(ulong *)(data + (uVar11 - 2 & uVar2)) & uVar16) * 0x1fe35a7bd3579bd3 >>
                 (*(byte *)(piVar15 + 0xe) & 0x3f);
        uVar32 = uVar28 & 0xffffffff;
        uVar1 = *(ushort *)((long)piVar15 + uVar32 * 2 + 0x50);
        *(uint *)((long)piVar15 +
                 (ulong)(uint)((int)uVar28 << (*(byte *)(piVar15 + 2) & 0x1f)) * 4 +
                 (ulong)(piVar15[0x12] & (uint)uVar1) * 4 + lVar21) = uVar11 - 2;
        *(ushort *)((long)piVar15 + uVar32 * 2 + 0x50) = uVar1 + 1;
        uVar28 = (uVar16 & *(ulong *)(data + (uVar11 - 1 & uVar2))) * 0x1fe35a7bd3579bd3 >>
                 (*(byte *)(piVar15 + 0xe) & 0x3f);
        uVar16 = uVar28 & 0xffffffff;
        uVar1 = *(ushort *)((long)piVar15 + uVar16 * 2 + 0x50);
        *(uint *)((long)piVar15 +
                 (ulong)(uint)((int)uVar28 << (*(byte *)(piVar15 + 2) & 0x1f)) * 4 +
                 (ulong)(piVar15[0x12] & (uint)uVar1) * 4 + lVar21) = uVar11 - 1;
        *(ushort *)((long)piVar15 + uVar16 * 2 + 0x50) = uVar1 + 1;
      }
      break;
    case 10:
      if ((2 < uVar20) && (0x7f < uVar11)) {
        uVar28 = uVar23 - 0x7f;
        local_198 = (uVar23 + uVar16) - 0x7f;
        if (uVar23 < local_198) {
          local_198 = uVar23;
        }
        if (uVar28 < local_198) {
          local_1e0 = *(ulong *)(piVar15 + 10);
LAB_00107c6d:
          local_1d0 = uVar23 - uVar28;
          if (local_1d0 < 0x10) {
            local_1d0 = 0xf;
          }
          local_1d0 = local_1e0 - local_1d0;
          uVar16 = (ulong)((uint)uVar28 & uVar2);
          uVar32 = (ulong)((uint)(*(int *)(data + uVar16) * 0x1e35a7bd) >> 0xf);
          uVar39 = (ulong)(uint)piVar15[uVar32 + 0xc];
          pBVar38 = (BrotliHasherParams *)((local_1e0 & uVar28) * 2 + 1);
          piVar15[uVar32 + 0xc] = (uint)uVar28;
          lVar21 = 0x40;
          local_1f8 = 0;
          local_1c8 = 0;
          pBVar34 = (BrotliHasherParams *)((local_1e0 & uVar28) * 2);
LAB_00107ce1:
          if ((uVar28 != uVar39) && (lVar21 != 0 && uVar28 - uVar39 <= local_1d0)) {
            uVar22 = (uint)uVar39;
            uVar32 = local_1c8;
            if (local_1f8 < local_1c8) {
              uVar32 = local_1f8;
            }
            puVar14 = data + uVar32 + (uVar22 & uVar2);
            uVar43 = 0x80 - uVar32;
            if (7 < uVar43) {
              uVar42 = uVar43 & 0xfffffffffffffff8;
              lVar33 = 0;
              uVar25 = 0;
LAB_00107d8a:
              local_1f0 = pBVar38;
              if (*(ulong *)(puVar14 + uVar25 * 8) ==
                  *(ulong *)(data + uVar25 * 8 + uVar32 + uVar16)) goto code_r0x00107d97;
              uVar25 = *(ulong *)(data + uVar25 * 8 + uVar32 + uVar16) ^
                       *(ulong *)(puVar14 + uVar25 * 8);
              uVar43 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
              uVar25 = (uVar43 >> 3 & 0x1fffffff) - lVar33;
              goto LAB_00107df6;
            }
            uVar42 = 0;
            goto LAB_00107e84;
          }
          piVar15[(long)(pBVar34 + 0x199a) + 6] = piVar15[0x2000c];
          iVar10 = piVar15[0x2000c];
          goto LAB_00107d12;
        }
      }
    }
  }
  else {
    if (iVar10 < 0x2a) {
      if (((iVar10 == 0x28) || (iVar10 == 0x29)) && ((2 < uVar20 && (2 < uVar11)))) {
        uVar16 = uVar23 - 3;
        uVar22 = (uint)(*(int *)(data + ((uint)uVar16 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar28 = (ulong)uVar22;
        uVar1 = *(ushort *)(piVar15 + 0x2000a);
        uVar30 = uVar1 + 1;
        *(ushort *)(piVar15 + 0x2000a) = uVar30;
        uVar32 = uVar16 - (uint)piVar15[uVar28 + 10];
        if (0xfffe < uVar32) {
          uVar32 = 0xffff;
        }
        *(char *)((long)piVar15 + (uVar16 & 0xffff) + 0x30028) = (char)uVar22;
        *(short *)(piVar15 + (ulong)uVar1 + 0x1000a) = (short)uVar32;
        *(undefined2 *)((long)piVar15 + (ulong)uVar1 * 4 + 0x4002a) =
             *(undefined2 *)((long)piVar15 + uVar28 * 2 + 0x20028);
        piVar15[uVar28 + 10] = (uint)uVar16;
        *(ushort *)((long)piVar15 + uVar28 * 2 + 0x20028) = uVar1;
        uVar16 = uVar23 - 2;
        uVar22 = (uint)(*(int *)(data + ((uint)uVar16 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar28 = (ulong)uVar22;
        uVar26 = uVar1 + 2;
        *(ushort *)(piVar15 + 0x2000a) = uVar26;
        uVar32 = uVar16 - (uint)piVar15[uVar28 + 10];
        *(char *)((long)piVar15 + (uVar16 & 0xffff) + 0x30028) = (char)uVar22;
        if (0xfffe < uVar32) {
          uVar32 = 0xffff;
        }
        *(short *)(piVar15 + (ulong)uVar30 + 0x1000a) = (short)uVar32;
        *(undefined2 *)((long)piVar15 + (ulong)uVar30 * 4 + 0x4002a) =
             *(undefined2 *)((long)piVar15 + uVar28 * 2 + 0x20028);
        piVar15[uVar28 + 10] = (uint)uVar16;
        *(ushort *)((long)piVar15 + uVar28 * 2 + 0x20028) = uVar30;
        uVar28 = uVar23 - 1;
        uVar22 = (uint)(*(int *)(data + ((uint)uVar28 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar16 = (ulong)uVar22;
        *(ushort *)(piVar15 + 0x2000a) = uVar1 + 3;
        uVar32 = uVar28 - (uint)piVar15[uVar16 + 10];
        if (0xfffe < uVar32) {
          uVar32 = 0xffff;
        }
        *(char *)((long)piVar15 + (uVar28 & 0xffff) + 0x30028) = (char)uVar22;
        *(short *)(piVar15 + (ulong)uVar26 + 0x1000a) = (short)uVar32;
        *(undefined2 *)((long)piVar15 + (ulong)uVar26 * 4 + 0x4002a) =
             *(undefined2 *)((long)piVar15 + uVar16 * 2 + 0x20028);
        piVar15[uVar16 + 10] = (uint)uVar28;
        *(ushort *)((long)piVar15 + uVar16 * 2 + 0x20028) = uVar26;
      }
      goto switchD_001078f4_caseD_7;
    }
    if (iVar10 == 0x2a) {
      if ((2 < uVar20) && (2 < uVar11)) {
        uVar16 = uVar23 - 3;
        uVar22 = (uint)(*(int *)(data + ((uint)uVar16 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar32 = (ulong)uVar22;
        uVar36 = uVar22 & 0x1ff;
        uVar1 = *(ushort *)((long)piVar15 + (ulong)uVar36 * 2 + 0x140028);
        *(ushort *)((long)piVar15 + (ulong)uVar36 * 2 + 0x140028) = uVar1 + 1;
        uVar37 = uVar1 & 0x1ff;
        uVar28 = uVar16 - (uint)piVar15[uVar32 + 10];
        *(char *)((long)piVar15 + (uVar16 & 0xffff) + 0x30028) = (char)uVar22;
        if (0xfffe < uVar28) {
          uVar28 = 0xffff;
        }
        *(short *)((long)piVar15 + (ulong)uVar37 * 4 + (ulong)(uVar36 << 0xb) + 0x40028) =
             (short)uVar28;
        *(undefined2 *)((long)piVar15 + (ulong)uVar37 * 4 + (ulong)(uVar36 << 0xb) + 0x4002a) =
             *(undefined2 *)((long)piVar15 + uVar32 * 2 + 0x20028);
        piVar15[uVar32 + 10] = (uint)uVar16;
        *(short *)((long)piVar15 + uVar32 * 2 + 0x20028) = (short)uVar37;
        uVar16 = uVar23 - 2;
        uVar37 = (uint)(*(int *)(data + ((uint)uVar16 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar28 = (ulong)uVar37;
        uVar22 = uVar37 & 0x1ff;
        uVar1 = *(ushort *)((long)piVar15 + (ulong)uVar22 * 2 + 0x140028);
        *(ushort *)((long)piVar15 + (ulong)uVar22 * 2 + 0x140028) = uVar1 + 1;
        uVar36 = uVar1 & 0x1ff;
        uVar32 = uVar16 - (uint)piVar15[uVar28 + 10];
        *(char *)((long)piVar15 + (uVar16 & 0xffff) + 0x30028) = (char)uVar37;
        if (0xfffe < uVar32) {
          uVar32 = 0xffff;
        }
        *(short *)((long)piVar15 + (ulong)uVar36 * 4 + (ulong)(uVar22 << 0xb) + 0x40028) =
             (short)uVar32;
        *(undefined2 *)((long)piVar15 + (ulong)uVar36 * 4 + (ulong)(uVar22 << 0xb) + 0x4002a) =
             *(undefined2 *)((long)piVar15 + uVar28 * 2 + 0x20028);
        piVar15[uVar28 + 10] = (uint)uVar16;
        *(short *)((long)piVar15 + uVar28 * 2 + 0x20028) = (short)uVar36;
        uVar16 = uVar23 - 1;
        uVar37 = (uint)(*(int *)(data + ((uint)uVar16 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar32 = (ulong)uVar37;
        uVar22 = uVar37 & 0x1ff;
        uVar1 = *(ushort *)((long)piVar15 + (ulong)uVar22 * 2 + 0x140028);
        *(ushort *)((long)piVar15 + (ulong)uVar22 * 2 + 0x140028) = uVar1 + 1;
        uVar36 = uVar1 & 0x1ff;
        uVar28 = uVar16 - (uint)piVar15[uVar32 + 10];
        *(char *)((long)piVar15 + (uVar16 & 0xffff) + 0x30028) = (char)uVar37;
        if (0xfffe < uVar28) {
          uVar28 = 0xffff;
        }
        *(short *)((long)piVar15 + (ulong)uVar36 * 4 + (ulong)(uVar22 << 0xb) + 0x40028) =
             (short)uVar28;
        *(undefined2 *)((long)piVar15 + (ulong)uVar36 * 4 + (ulong)(uVar22 << 0xb) + 0x4002a) =
             *(undefined2 *)((long)piVar15 + uVar32 * 2 + 0x20028);
        piVar15[uVar32 + 10] = (uint)uVar16;
        *(short *)((long)piVar15 + uVar32 * 2 + 0x20028) = (short)uVar36;
      }
      goto switchD_001078f4_caseD_7;
    }
    if (((iVar10 != 0x36) || (uVar20 < 7)) || (uVar11 < 3)) goto switchD_001078f4_caseD_7;
    uVar22 = uVar11 - 3;
    piVar15[(ulong)((uint)((ulong)(*(long *)(data + (uVar22 & uVar2)) * 0x35a7bd1e35a7bd00) >> 0x2c)
                   + (uVar22 >> 3 & 3)) + 10] = uVar22;
    uVar22 = uVar11 - 2;
    piVar15[(ulong)((uint)((ulong)(*(long *)(data + (uVar22 & uVar2)) * 0x35a7bd1e35a7bd00) >> 0x2c)
                   + (uVar22 >> 3 & 3)) + 10] = uVar22;
    uVar22 = (uint)((ulong)(*(long *)(data + (uVar11 - 1 & uVar2)) * 0x35a7bd1e35a7bd00) >> 0x2c);
LAB_00107bfe:
    piVar15[(ulong)(uVar22 + (uVar11 - 1 >> 3 & 3)) + 10] = uVar11 - 1;
  }
switchD_001078f4_caseD_7:
  uVar16 = s->last_flush_pos_;
  uVar22 = (uint)uVar16;
  if (0xbfffffff < uVar16) {
    uVar22 = ((int)(uVar22 * 2) >> 1 & 0xc0000000U) + (uVar22 & 0x3fffffff) + 0x80000000;
  }
  psVar24 = &s->num_commands_;
  if (((s->params).quality < 10) ||
     (iVar10 = BrotliIsMostlyUTF8(data,(ulong)uVar22,mask,s->input_pos_ - uVar16,0.75), iVar10 != 0)
     ) {
    local_1f0 = (BrotliHasherParams *)0x2;
  }
  else {
    local_1f0 = (BrotliHasherParams *)0x3;
  }
  sVar41 = *psVar24;
  if ((sVar41 != 0) && (s->last_insert_len_ == 0)) {
    pCVar17 = s->commands_;
    uVar28 = (1L << ((byte)(s->params).lgwin & 0x3f)) - 0x10;
    uVar16 = s->last_processed_pos_ - (ulong)(pCVar17[sVar41 - 1].copy_len_ & 0x1ffffff);
    if (uVar28 <= uVar16) {
      uVar16 = uVar28;
    }
    iVar10 = s->dist_cache_[0];
    uVar1 = pCVar17[sVar41 - 1].dist_prefix_;
    uVar37 = uVar1 & 0x3ff;
    uVar31 = (s->params).dist.num_direct_distance_codes;
    uVar22 = uVar31 + 0x10;
    if (uVar22 <= uVar37) {
      uVar36 = (s->params).dist.distance_postfix_bits;
      bVar19 = (byte)uVar36;
      uVar37 = (uVar37 - uVar31) - 0x10;
      uVar37 = (~(-1 << (bVar19 & 0x1f)) & uVar37) + uVar22 +
               (pCVar17[sVar41 - 1].dist_extra_ +
                (((uVar37 >> (uVar36 & 0x1f) & 1) != 0) + 2 << ((byte)(uVar1 >> 10) & 0x1f)) + -4 <<
               (bVar19 & 0x1f));
    }
    if ((ulong)(uVar37 - 0xf) == (long)iVar10 || uVar37 < 0x10) {
      if (uVar20 != 0 && (ulong)(long)iVar10 <= uVar16) {
        uVar20 = (s->ringbuffer_).mask_;
        puVar14 = (s->ringbuffer_).buffer_;
        do {
          uVar22 = (uint)uVar23;
          if (puVar14[uVar22 & uVar20] != puVar14[uVar22 - iVar10 & uVar20]) goto LAB_00108d75;
          pCVar17[sVar41 - 1].copy_len_ = pCVar17[sVar41 - 1].copy_len_ + 1;
          uVar23 = (ulong)(uVar22 + 1);
          uVar22 = (int)uVar12 - 1;
          uVar12 = (ulong)uVar22;
        } while (uVar22 != 0);
        uVar12 = 0;
        uVar23 = (ulong)(((int)local_1e8 + uVar11) - (int)local_208);
      }
LAB_00108d75:
      uVar11 = pCVar17[sVar41 - 1].insert_len_;
      uVar22 = (pCVar17[sVar41 - 1].copy_len_ >> 0x19) + (pCVar17[sVar41 - 1].copy_len_ & 0x1ffffff)
      ;
      uVar20 = uVar11;
      if (5 < (ulong)uVar11) {
        if (uVar11 < 0x82) {
          uVar16 = (ulong)uVar11 - 2;
          uVar11 = 0x1f;
          uVar20 = (uint)uVar16;
          if (uVar20 != 0) {
            for (; uVar20 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
          uVar20 = (int)(uVar16 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar11 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar11 < 0x842) {
          uVar20 = 0x1f;
          if (uVar11 - 0x42 != 0) {
            for (; uVar11 - 0x42 >> uVar20 == 0; uVar20 = uVar20 - 1) {
            }
          }
          uVar20 = (uVar20 ^ 0xffe0) + 0x2a;
        }
        else {
          uVar20 = 0x15;
          if (0x1841 < uVar11) {
            uVar20 = (uint)(ushort)(0x17 - (uVar11 < 0x5842));
          }
        }
      }
      if (uVar22 < 10) {
        uVar11 = uVar22 - 2;
      }
      else if (uVar22 < 0x86) {
        uVar11 = 0x1f;
        uVar37 = (uint)((ulong)uVar22 - 6);
        if (uVar37 != 0) {
          for (; uVar37 >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        uVar11 = (int)((ulong)uVar22 - 6 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar11 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar11 = 0x17;
        if (uVar22 < 0x846) {
          uVar11 = 0x1f;
          if (uVar22 - 0x46 != 0) {
            for (; uVar22 - 0x46 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
          uVar11 = (uVar11 ^ 0xffe0) + 0x2c;
        }
      }
      uVar30 = (ushort)uVar11;
      uVar7 = (uVar30 & 7) + ((ushort)uVar20 & 7) * 8;
      if ((((uVar1 & 0x3ff) == 0) && ((ushort)uVar20 < 8)) && (uVar30 < 0x10)) {
        if (7 < uVar30) {
          uVar7 = uVar7 + 0x40;
        }
      }
      else {
        iVar10 = ((uVar20 & 0xffff) >> 3) * 3 + ((uVar11 & 0xffff) >> 3);
        uVar7 = uVar7 + ((ushort)(0x520d40 >> ((char)iVar10 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar10 * 0x40 + 0x40;
      }
      pCVar17[sVar41 - 1].cmd_prefix_ = uVar7;
    }
  }
  iVar10 = (s->params).quality;
  uVar12 = uVar12 & 0xffffffff;
  puVar3 = s->hasher_;
  piVar15 = s->dist_cache_;
  last_insert_len = &s->last_insert_len_;
  pCVar17 = s->commands_ + sVar41;
  num_literals = &s->num_literals_;
  local_210 = (BrotliHasherParams *)psVar24;
  if (iVar10 == 0xb) {
    BrotliCreateHqZopfliBackwardReferences
              (m,uVar12,uVar23,data,mask,&s->params,puVar3,piVar15,last_insert_len,pCVar17,psVar24,
               num_literals);
  }
  else if (iVar10 == 10) {
    BrotliCreateZopfliBackwardReferences
              (m,uVar12,uVar23,data,mask,&s->params,puVar3,piVar15,last_insert_len,pCVar17,psVar24,
               num_literals);
  }
  else {
    BrotliCreateBackwardReferences
              (uVar12,uVar23,data,mask,&s->params,puVar3,piVar15,last_insert_len,pCVar17,psVar24,
               num_literals);
  }
  iVar10 = (s->params).lgwin;
  iVar8 = (s->params).lgblock;
  if (iVar8 < iVar10) {
    iVar8 = iVar10;
  }
  cVar18 = '\x17';
  if (iVar8 < 0x17) {
    cVar18 = (char)iVar8;
  }
  uVar23 = 1L << (cVar18 + 1U & 0x3f);
  uVar4 = s->input_pos_;
  uVar5 = s->last_flush_pos_;
  EnsureInitialized(s);
  if ((s->params).quality < 4) {
    bVar44 = 0x2ffe < s->num_commands_ + s->num_literals_;
  }
  else {
    bVar44 = false;
  }
  uVar11 = (uint)local_1c0 | is_last;
  local_1c0 = CONCAT44(local_1c0._4_4_,uVar11);
  if (((uVar11 != 0) || (bVar44)) ||
     ((uVar23 < (uVar4 - uVar5) + (1L << ((byte)(s->params).lgblock & 0x3f)) ||
      ((uVar23 = uVar23 >> 3, uVar23 <= s->num_literals_ ||
       (uVar16._0_4_ = local_210->type, uVar16._4_4_ = local_210->bucket_bits, uVar23 <= uVar16)))))
     ) {
    uVar23 = s->last_insert_len_;
    if (uVar23 != 0) {
      pCVar17 = s->commands_;
      sVar41 = s->num_commands_;
      s->num_commands_ = sVar41 + 1;
      pCVar17[sVar41].insert_len_ = (uint32_t)uVar23;
      pCVar17[sVar41].copy_len_ = 0x8000000;
      pCVar17[sVar41].dist_extra_ = 0;
      pCVar17[sVar41].dist_prefix_ = 0x10;
      if (uVar23 < 6) {
        uVar16 = uVar23 & 0xffffffff;
      }
      else if (uVar23 < 0x82) {
        uVar11 = 0x1f;
        uVar20 = (uint)(uVar23 - 2);
        if (uVar20 != 0) {
          for (; uVar20 >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        uVar16 = (ulong)((int)(uVar23 - 2 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar11 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar23 < 0x842) {
        uVar20 = (uint32_t)uVar23 - 0x42;
        uVar11 = 0x1f;
        if (uVar20 != 0) {
          for (; uVar20 >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        uVar16 = (ulong)((uVar11 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar16 = 0x15;
        if (0x1841 < uVar23) {
          uVar16 = (ulong)(ushort)(0x17 - (uVar23 < 0x5842));
        }
      }
      iVar10 = (int)((uVar16 & 0xffff) >> 3) * 3;
      pCVar17[sVar41].cmd_prefix_ =
           ((ushort)(0x520d40 >> ((char)iVar10 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar10 * 0x40 +
           ((ushort)uVar16 & 7) * 8 + 0x42;
      s->num_literals_ = s->num_literals_ + uVar23;
      s->last_insert_len_ = 0;
    }
    if ((is_last != 0) || (s->input_pos_ != s->last_flush_pos_)) {
      uVar16 = s->input_pos_ - s->last_flush_pos_;
      puVar14 = GetBrotliStorage(s,(ulong)((int)uVar16 * 2 + 0x1f7));
      bVar19 = s->last_bytes_bits_;
      storage_ix_1 = (size_t)bVar19;
      *puVar14 = (uint8_t)s->last_bytes_;
      puVar14[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
      uVar23 = s->last_flush_pos_;
      uVar16 = uVar16 & 0xffffffff;
      uVar11 = (uint)uVar23;
      if (0xbfffffff < uVar23) {
        uVar11 = (uVar11 & 0x3fffffff) + ((int)(uVar11 * 2) >> 1 & 0xc0000000U) + 0x80000000;
      }
      local_208 = CONCAT44(local_208._4_4_,uVar11);
      prev_byte = s->prev_byte_;
      prev_byte2 = s->prev_byte2_;
      sVar41 = s->num_literals_;
      pCVar17 = s->commands_;
      num_commands = s->num_commands_;
      piVar40 = s->saved_dist_cache_;
      pBVar29 = s;
      psVar24 = &table_size;
      for (lVar21 = 0x10; lVar21 != 0; lVar21 = lVar21 + -1) {
        *psVar24 = *(size_t *)&pBVar29->params;
        pBVar29 = (BrotliEncoderState *)((long)pBVar29 + (ulong)bVar46 * -0x10 + 8);
        psVar24 = psVar24 + (ulong)bVar46 * -2 + 1;
      }
      if (uVar16 == 0) {
        *(ulong *)(puVar14 + (bVar19 >> 3)) = 3L << (bVar19 & 7) | (ulong)puVar14[bVar19 >> 3];
        storage_ix_1 = (size_t)(bVar19 + 9 & 0xfffffff8);
        psVar24 = local_200;
      }
      else {
        local_1f8 = num_commands;
        iVar10 = ShouldCompress(data,mask,uVar23,uVar16,sVar41,num_commands);
        if (iVar10 == 0) {
          uVar6 = *(undefined8 *)(s->saved_dist_cache_ + 2);
          *(undefined8 *)piVar15 = *(undefined8 *)piVar40;
          *(undefined8 *)(s->dist_cache_ + 2) = uVar6;
          BrotliStoreUncompressedMetaBlock
                    (is_last,data,local_208 & 0xffffffff,mask,uVar16,&storage_ix_1,puVar14);
          psVar24 = local_200;
        }
        else {
          local_1d0 = CONCAT71(local_1d0._1_7_,*puVar14);
          local_1e0 = CONCAT71(local_1e0._1_7_,puVar14[1]);
          local_1c8 = storage_ix_1 & 0xff;
          iVar10 = (s->params).quality;
          if (iVar10 < 3) {
            BrotliStoreMetaBlockFast
                      (m,data,local_208 & 0xffffffff,uVar16,mask,is_last,&s->params,pCVar17,
                       local_1f8,&storage_ix_1,puVar14);
          }
          else if (iVar10 == 3) {
            BrotliStoreMetaBlockTrivial
                      (m,data,local_208 & 0xffffffff,uVar16,mask,is_last,&s->params,pCVar17,
                       local_1f8,&storage_ix_1,puVar14);
          }
          else {
            BrotliInitBlockSplit((BlockSplit *)&storage_ix);
            BrotliInitBlockSplit(&local_160);
            BrotliInitBlockSplit(&local_130);
            pBVar38 = local_1f0;
            local_c0 = (HistogramDistance *)0x0;
            sStack_b8 = 0;
            local_d0 = (HistogramCommand *)0x0;
            sStack_c8 = 0;
            local_e0 = (HistogramLiteral *)0x0;
            sStack_d8 = 0;
            local_f0 = (uint32_t *)0x0;
            sStack_e8 = 0;
            local_100 = (uint32_t *)0x0;
            sStack_f8 = 0;
            iVar10 = (s->params).quality;
            uVar23 = local_208 & 0xffffffff;
            local_1d8 = (int *)(ulong)prev_byte2;
            local_1e8 = CONCAT44(local_1e8._4_4_,(uint)prev_byte);
            literal_context_mode = (ContextType)local_1f0;
            local_1c0 = uVar23;
            if (iVar10 < 10) {
              num_literal_contexts = 1;
              local_1b0 = (uint32_t *)0x0;
              if ((s->params).disable_literal_context_modeling == 0) {
                DecideOverLiteralContextModeling
                          (data,uVar23,uVar16,mask,iVar10,(s->params).size_hint,
                           &num_literal_contexts,&local_1b0);
                prev_byte = (byte)local_1e8;
                prev_byte2 = (byte)local_1d8;
              }
              BrotliBuildMetaBlockGreedy
                        (m,data,uVar23,mask,prev_byte,prev_byte2,"" + (literal_context_mode << 9),
                         num_literal_contexts,local_1b0,pCVar17,local_1f8,
                         (MetaBlockSplit *)&storage_ix);
              pBVar38 = local_1f0;
            }
            else {
              BrotliBuildMetaBlock
                        (m,data,uVar23,mask,(BrotliEncoderParams *)&table_size,prev_byte,prev_byte2,
                         pCVar17,local_1f8,literal_context_mode,(MetaBlockSplit *)&storage_ix);
            }
            if (3 < (s->params).quality) {
              uVar31 = 0x220;
              if (local_70 < 0x220) {
                uVar31 = local_70;
              }
              BrotliOptimizeHistograms(uVar31,(MetaBlockSplit *)&storage_ix);
            }
            BrotliStoreMetaBlock
                      (m,data,local_1c0,uVar16,mask,(uint8_t)local_1e8,(uint8_t)local_1d8,is_last,
                       (BrotliEncoderParams *)&table_size,(ContextType)pBVar38,pCVar17,local_1f8,
                       (MetaBlockSplit *)&storage_ix,&storage_ix_1,puVar14);
            BrotliDestroyBlockSplit(m,(BlockSplit *)&storage_ix);
            BrotliDestroyBlockSplit(m,&local_160);
            BrotliDestroyBlockSplit(m,&local_130);
            BrotliFree(m,local_100);
            local_100 = (uint32_t *)0x0;
            BrotliFree(m,local_f0);
            local_f0 = (uint32_t *)0x0;
            BrotliFree(m,local_e0);
            local_e0 = (HistogramLiteral *)0x0;
            BrotliFree(m,local_d0);
            local_d0 = (HistogramCommand *)0x0;
            BrotliFree(m,local_c0);
          }
          psVar24 = local_200;
          if (uVar16 + 4 < storage_ix_1 >> 3) {
            uVar6 = *(undefined8 *)(s->saved_dist_cache_ + 2);
            *(undefined8 *)piVar15 = *(undefined8 *)piVar40;
            *(undefined8 *)(s->dist_cache_ + 2) = uVar6;
            *puVar14 = (uint8_t)local_1d0;
            puVar14[1] = (uint8_t)local_1e0;
            storage_ix_1 = local_1c8;
            BrotliStoreUncompressedMetaBlock
                      (is_last,data,local_208 & 0xffffffff,mask,uVar16,&storage_ix_1,puVar14);
          }
        }
      }
      uVar23 = storage_ix_1 >> 3;
      s->last_bytes_ = (ushort)puVar14[uVar23];
      s->last_bytes_bits_ = (byte)storage_ix_1 & 7;
      s->last_flush_pos_ = s->input_pos_;
      iVar10 = UpdateLastProcessedPos(s);
      if ((iVar10 != 0) && (puVar3 = s->hasher_, puVar3 != (HasherHandle)0x0)) {
        puVar3[0x14] = '\0';
        puVar3[0x15] = '\0';
        puVar3[0x16] = '\0';
        puVar3[0x17] = '\0';
      }
      uVar16 = s->last_flush_pos_;
      if (uVar16 != 0) {
        s->prev_byte_ = data[uVar2 & (int)uVar16 - 1U];
      }
      if (1 < uVar16) {
        s->prev_byte2_ = data[uVar2 & (int)uVar16 - 2U];
      }
      local_210->type = 0;
      local_210->bucket_bits = 0;
      *(ulong *)((long)local_210 + 8) = 0;
      uVar6 = *(undefined8 *)(s->dist_cache_ + 2);
      *(undefined8 *)piVar40 = *(undefined8 *)piVar15;
      *(undefined8 *)(s->saved_dist_cache_ + 2) = uVar6;
      *local_1b8 = puVar14;
      *psVar24 = uVar23;
      return 1;
    }
  }
  else {
    iVar10 = UpdateLastProcessedPos(s);
    if ((iVar10 != 0) && (puVar3 = s->hasher_, puVar3 != (HasherHandle)0x0)) {
      puVar3[0x14] = '\0';
      puVar3[0x15] = '\0';
      puVar3[0x16] = '\0';
      puVar3[0x17] = '\0';
    }
  }
  *local_200 = 0;
  return 1;
code_r0x00107d97:
  uVar25 = uVar25 + 1;
  lVar33 = lVar33 + -8;
  if (uVar43 >> 3 == uVar25) goto code_r0x00107da3;
  goto LAB_00107d8a;
code_r0x00107da3:
  puVar14 = puVar14 + -lVar33;
LAB_00107e84:
  uVar43 = uVar43 & 7;
  uVar25 = uVar42;
  if (uVar43 != 0) {
    uVar35 = uVar42 | uVar43;
    do {
      uVar25 = uVar42;
      if (data[uVar42 + uVar32 + uVar16] != *puVar14) break;
      puVar14 = puVar14 + 1;
      uVar42 = uVar42 + 1;
      uVar43 = uVar43 - 1;
      uVar25 = uVar35;
    } while (uVar43 != 0);
  }
LAB_00107df6:
  uVar25 = uVar25 + uVar32;
  local_210 = pBVar34;
  if (uVar25 < 0x80) {
    pBVar27 = (BrotliHasherParams *)((uVar39 & local_1e0) * 2);
    if (data[uVar25 + (uVar22 & uVar2)] < data[uVar25 + uVar16]) {
      piVar15[(long)(pBVar34 + 0x199a) + 6] = uVar22;
      pBVar27 = (BrotliHasherParams *)((ulong)pBVar27 | 1);
      pBVar34 = pBVar27;
      local_1f8 = uVar25;
    }
    else {
      piVar15[(long)(pBVar38 + 0x199a) + 6] = uVar22;
      pBVar38 = pBVar27;
      local_1c8 = uVar25;
    }
    uVar39 = (ulong)(uint)piVar15[(long)(pBVar27 + 0x199a) + 6];
    bVar44 = true;
  }
  else {
    piVar15[(long)(pBVar34 + 0x199a) + 6] = piVar15[(uVar39 & local_1e0) * 2 + 0x2000e];
    iVar10 = piVar15[(uVar39 & local_1e0) * 2 + 0x2000f];
LAB_00107d12:
    piVar15[(long)(pBVar38 + 0x199a) + 6] = iVar10;
    bVar44 = false;
  }
  lVar21 = lVar21 + -1;
  if (!bVar44) goto LAB_00107eba;
  goto LAB_00107ce1;
LAB_00107eba:
  uVar28 = uVar28 + 1;
  local_1d8 = piVar15;
  local_1a0 = uVar23;
  if (uVar28 == local_198) goto switchD_001078f4_caseD_7;
  goto LAB_00107c6d;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  uint32_t bytes = (uint32_t)delta;
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;
  ContextType literal_context_mode;

  if (!EnsureInitialized(s)) return BROTLI_FALSE;
  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    uint8_t* storage;
    size_t storage_ix = s->last_bytes_bits_;
    size_t table_size;
    int* table;

    if (delta == 0 && !is_last) {
      /* We have no new input data and we don't have to finish the stream, so
         nothing to do. */
      *out_size = 0;
      return BROTLI_TRUE;
    }
    storage = GetBrotliStorage(s, 2 * bytes + 503);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          s->cmd_depths_, s->cmd_bits_,
          &s->cmd_code_numbits_, s->cmd_code_,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }

  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hasher_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);

  literal_context_mode = ChooseContextMode(
      &s->params, data, WrapPosition(s->last_flush_pos_),
      mask, (size_t)(s->input_pos_ - s->last_flush_pos_));

  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->num_commands_ && s->last_insert_len_ == 0) {
    ExtendLastCommand(s, &bytes, &wrapped_last_processed_pos);
  }

  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateZopfliBackwardReferences(m,
        bytes, wrapped_last_processed_pos,
        data, mask, &s->params, s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateHqZopfliBackwardReferences(m,
        bytes, wrapped_last_processed_pos,
        data, mask, &s->params, s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(
        bytes, wrapped_last_processed_pos,
        data, mask, &s->params, s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
  }

  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO: Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HasherReset(s->hasher_);
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  BROTLI_DCHECK(s->input_pos_ >= s->last_flush_pos_);
  BROTLI_DCHECK(s->input_pos_ > s->last_flush_pos_ || is_last);
  BROTLI_DCHECK(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 503);
    size_t storage_ix = s->last_bytes_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        literal_context_mode, &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HasherReset(s->hasher_);
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->saved_dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}